

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[54],kj::String,kj::String,char>
          (String *__return_storage_ptr__,kj *this,char (*params) [54],String *params_1,
          String *params_2,char *params_3)

{
  char (*value) [54];
  String *pSVar1;
  char *value_00;
  char local_61 [1];
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  String *local_30;
  char *params_local_3;
  String *params_local_2;
  String *params_local_1;
  char (*params_local) [54];
  
  local_30 = params_2;
  params_local_3 = (char *)params_1;
  params_local_2 = (String *)params;
  params_local_1 = (String *)this;
  params_local = (char (*) [54])__return_storage_ptr__;
  value = ::const((char (*) [54])this);
  local_40 = toCharSequence<char_const(&)[54]>(value);
  pSVar1 = fwd<kj::String>(params_local_2);
  local_50 = toCharSequence<kj::String>(pSVar1);
  pSVar1 = fwd<kj::String>((NoInfer<kj::String> *)params_local_3);
  local_60 = toCharSequence<kj::String>(pSVar1);
  value_00 = fwd<char>((NoInfer<char> *)local_30);
  local_61[0] = (char)toCharSequence<char>(value_00);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)&local_40,&local_50,&local_60,
             (ArrayPtr<const_char> *)local_61,(FixedArray<char,_1UL> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}